

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O2

void __thiscall banksia::ChessBoard::takeBack(ChessBoard *this,Hist *hist)

{
  pointer pPVar1;
  int iVar2;
  pointer pPVar3;
  Piece PVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  PVar4 = BoardCore::getPiece(&this->super_BoardCore,(hist->move).super_Move.dest);
  (this->super_BoardCore).pieces.super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>
  ._M_impl.super__Vector_impl_data._M_start[(hist->move).super_Move.from] = PVar4;
  iVar5 = (hist->move).super_Move.dest;
  pPVar3 = (this->super_BoardCore).pieces.
           super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((PVar4.type == pawn) && (hist->enpassant == iVar5)) {
    lVar7 = (long)iVar5;
    iVar5 = (uint)(PVar4.side == white) * 0x10 + iVar5 + -8;
    pPVar1 = pPVar3 + lVar7;
    pPVar1->type = empty;
    pPVar1->side = none;
  }
  pPVar3[iVar5] = hist->cap;
  if (PVar4.type == king) {
    iVar5 = (hist->move).super_Move.from;
    iVar2 = (hist->move).super_Move.dest;
    if (((iVar5 - iVar2) + 2U & 0xfffffffb) == 0) {
      iVar6 = iVar5 + 3;
      if (iVar2 <= iVar5) {
        iVar6 = iVar5 + -4;
      }
      (this->super_BoardCore).pieces.
      super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
      super__Vector_impl_data._M_start[iVar6] = (Piece)((ulong)(7 < iVar2) << 0x20 | 3);
      pPVar3 = (this->super_BoardCore).pieces.
               super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
               super__Vector_impl_data._M_start + (iVar5 + iVar2) / 2;
      pPVar3->type = empty;
      pPVar3->side = none;
    }
  }
  if ((hist->move).super_Move.promotion != empty) {
    PVar4.type = pawn;
    PVar4.side = black;
    if ((hist->move).super_Move.dest < 8) {
      PVar4.type = pawn;
      PVar4.side = white;
    }
    (this->super_BoardCore).pieces.
    super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
    super__Vector_impl_data._M_start[(hist->move).super_Move.from] = PVar4;
  }
  (this->super_BoardCore).status = hist->status;
  this->castleRights[0] = hist->castleRights[0];
  this->castleRights[1] = hist->castleRights[1];
  this->enpassant = hist->enpassant;
  (this->super_BoardCore).quietCnt = hist->quietCnt;
  (this->super_BoardCore).hashKey = hist->hashKey;
  return;
}

Assistant:

void ChessBoard::takeBack(const Hist& hist) {
    auto movep = getPiece(hist.move.dest);
    setPiece(hist.move.from, movep);
    
    int capPos = hist.move.dest;
    
    if (movep.type == PieceType::pawn && hist.enpassant == hist.move.dest) {
        capPos = hist.move.dest + (movep.side == Side::white ? +8 : -8);
        setEmpty(hist.move.dest);
    }
    setPiece(capPos, hist.cap);
    
    if (movep.type == PieceType::king) {
        if (abs(hist.move.from - hist.move.dest) == 2) {
            int rookPos = hist.move.from + (hist.move.from < hist.move.dest ? 3 : -4);
            assert(isEmpty(rookPos));
            int newRookPos = (hist.move.from + hist.move.dest) / 2;
            setPiece(rookPos, Piece(PieceType::rook, hist.move.dest < 8 ? Side::black : Side::white));
            setEmpty(newRookPos);
        }
    }
    
    if (hist.move.promotion != PieceType::empty) {
        setPiece(hist.move.from, Piece(PieceType::pawn, hist.move.dest < 8 ? Side::white : Side::black));
    }
    
    status = hist.status;
    castleRights[0] = hist.castleRights[0];
    castleRights[1] = hist.castleRights[1];
    enpassant = hist.enpassant;
    quietCnt = hist.quietCnt;
    
    //    pieceList_takeback(hist);
    hashKey = hist.hashKey;
}